

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

uint64_t pstore::varint::details::decode9<unsigned_char*>(uchar *in)

{
  uint local_1c;
  ulong uStack_18;
  uint shift;
  uint64_t result;
  uchar *in_local;
  
  uStack_18 = 0;
  result = (uint64_t)(in + 1);
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 8) {
    uStack_18 = (ulong)*(byte *)result << ((byte)local_1c & 0x3f) | uStack_18;
    result = result + 1;
  }
  return uStack_18;
}

Assistant:

std::uint64_t decode9 (InputIterator in) {
                ++in; // skip the length byte
                auto result = std::uint64_t{0};
                for (auto shift = 0U; shift < 64U; shift += 8U) {
                    result |= std::uint64_t{*(in++)} << shift;
                }
                return result;
            }